

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PopStyleColor(int count)

{
  float fVar1;
  ImGuiContext *pIVar2;
  ImGuiColorMod *pIVar3;
  ImVec4 *pIVar4;
  ImGuiColorMod *backup;
  ImGuiContext *g;
  int count_local;
  
  pIVar2 = GImGui;
  for (g._4_4_ = count; 0 < g._4_4_; g._4_4_ = g._4_4_ + -1) {
    pIVar3 = ImVector<ImGuiColorMod>::back(&pIVar2->ColorStack);
    pIVar4 = (pIVar2->Style).Colors + pIVar3->Col;
    fVar1 = (pIVar3->BackupValue).y;
    pIVar4->x = (pIVar3->BackupValue).x;
    pIVar4->y = fVar1;
    fVar1 = (pIVar3->BackupValue).w;
    pIVar4->z = (pIVar3->BackupValue).z;
    pIVar4->w = fVar1;
    ImVector<ImGuiColorMod>::pop_back(&pIVar2->ColorStack);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColorMod& backup = g.ColorStack.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorStack.pop_back();
        count--;
    }
}